

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumCheckerboardTexture *
pbrt::SpectrumCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumCheckerboardTexture *pSVar17;
  undefined8 *puVar18;
  undefined4 extraout_var_03;
  AAMethod AVar19;
  uintptr_t iptr;
  allocator<char> local_136;
  allocator<char> local_135;
  int dim;
  Transform *local_130;
  SpectrumTextureHandle tex2;
  SpectrumTextureHandle tex1;
  TextureMapping2DHandle map;
  string local_108;
  string aa;
  string local_60;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aa,"dimension",(allocator<char> *)&local_108);
  iVar14 = TextureParameterDictionary::GetOneInt(parameters,&aa,2);
  std::__cxx11::string::~string((string *)&aa);
  dim = iVar14;
  if (iVar14 - 4U < 0xfffffffe) {
    Error<int&>(loc,"%d dimensional checkerboard texture not supported",&dim);
    pSVar17 = (SpectrumCheckerboardTexture *)0x0;
  }
  else {
    local_130 = renderFromTexture;
    iVar15 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar15) = 0;
    iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_00,iVar16) = 0x3f800000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aa,"tex1",(allocator<char> *)&local_108);
    local_38 = CONCAT44(extraout_var_00,iVar16) | 0x1000000000000;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)&tex1,(string *)parameters,(SpectrumHandle *)&aa,
               (SpectrumType)&local_38,(Allocator)0x0);
    std::__cxx11::string::~string((string *)&aa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aa,"tex2",(allocator<char> *)&local_108);
    local_40 = CONCAT44(extraout_var,iVar15) | 0x1000000000000;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)&tex2,(string *)parameters,(SpectrumHandle *)&aa,
               (SpectrumType)&local_40,(Allocator)0x0);
    std::__cxx11::string::~string((string *)&aa);
    if (iVar14 == 2) {
      TextureMapping2DHandle::Create(&map,parameters->dict,local_130,loc,alloc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"aamode",&local_135);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"closedform",&local_136);
      TextureParameterDictionary::GetOneString(&aa,parameters,&local_108,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_108);
      bVar13 = std::operator==(&aa,"none");
      AVar19 = None;
      if (!bVar13) {
        bVar13 = std::operator==(&aa,"closedform");
        AVar19 = ClosedForm;
        if (!bVar13) {
          Warning<std::__cxx11::string&>
                    (loc,
                     "Antialiasing mode \"%s\" not understood by Checkerboard2DTexture; using \"closedform\""
                     ,&aa);
        }
      }
      iVar14 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      pSVar17 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_01,iVar14);
      (pSVar17->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = (uintptr_t)
              map.
              super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
              .bits;
      (pSVar17->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits = 0;
      pSVar17->tex[0].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex1.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      pSVar17->tex[1].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex2.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      pSVar17->aaMethod = AVar19;
      std::__cxx11::string::~string((string *)&aa);
    }
    else {
      aa._M_dataplus._M_p = *(pointer *)(local_130->mInv).m[0];
      aa._M_string_length = *(size_type *)((local_130->mInv).m[0] + 2);
      aa.field_2._M_allocated_capacity = *(undefined8 *)(local_130->mInv).m[1];
      aa.field_2._8_8_ = *(undefined8 *)((local_130->mInv).m[1] + 2);
      uVar1 = *(undefined8 *)(local_130->mInv).m[2];
      uVar2 = *(undefined8 *)((local_130->mInv).m[2] + 2);
      uVar3 = *(undefined8 *)(local_130->mInv).m[3];
      uVar4 = *(undefined8 *)((local_130->mInv).m[3] + 2);
      uVar5 = *(undefined8 *)(local_130->m).m[0];
      uVar6 = *(undefined8 *)((local_130->m).m[0] + 2);
      uVar7 = *(undefined8 *)(local_130->m).m[1];
      uVar8 = *(undefined8 *)((local_130->m).m[1] + 2);
      uVar9 = *(undefined8 *)(local_130->m).m[2];
      uVar10 = *(undefined8 *)((local_130->m).m[2] + 2);
      uVar11 = *(undefined8 *)(local_130->m).m[3];
      uVar12 = *(undefined8 *)((local_130->m).m[3] + 2);
      iVar14 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
      puVar18 = (undefined8 *)CONCAT44(extraout_var_02,iVar14);
      *puVar18 = aa._M_dataplus._M_p;
      puVar18[1] = aa._M_string_length;
      puVar18[2] = aa.field_2._M_allocated_capacity;
      puVar18[3] = aa.field_2._8_8_;
      puVar18[4] = uVar1;
      puVar18[5] = uVar2;
      puVar18[6] = uVar3;
      puVar18[7] = uVar4;
      puVar18[8] = uVar5;
      puVar18[9] = uVar6;
      puVar18[10] = uVar7;
      puVar18[0xb] = uVar8;
      puVar18[0xc] = uVar9;
      puVar18[0xd] = uVar10;
      puVar18[0xe] = uVar11;
      puVar18[0xf] = uVar12;
      iVar14 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      pSVar17 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_03,iVar14);
      (pSVar17->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = 0;
      (pSVar17->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
           (ulong)puVar18 | 0x1000000000000;
      pSVar17->tex[0].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex1.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      pSVar17->tex[1].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex2.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      pSVar17->aaMethod = None;
    }
  }
  return pSVar17;
}

Assistant:

SpectrumCheckerboardTexture *SpectrumCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    SpectrumTextureHandle tex1 =
        parameters.GetSpectrumTexture("tex1", one, SpectrumType::Reflectance, alloc);
    SpectrumTextureHandle tex2 =
        parameters.GetSpectrumTexture("tex2", zero, SpectrumType::Reflectance, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        // Compute _aaMethod_ for _CheckerboardTexture_
        std::string aa = parameters.GetOneString("aamode", "closedform");
        AAMethod aaMethod;
        if (aa == "none")
            aaMethod = AAMethod::None;
        else if (aa == "closedform")
            aaMethod = AAMethod::ClosedForm;
        else {
            Warning(loc,
                    "Antialiasing mode \"%s\" not understood by "
                    "Checkerboard2DTexture; using \"closedform\"",
                    aa);
            aaMethod = AAMethod::ClosedForm;
        }
        return alloc.new_object<SpectrumCheckerboardTexture>(map, nullptr, tex1, tex2,
                                                             aaMethod);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<SpectrumCheckerboardTexture>(nullptr, map, tex1, tex2,
                                                             AAMethod::None);
    }
}